

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O3

void EMIT_OP_REG(CodeGenGenericContext *ctx,x86Command op,x86XmmReg reg1)

{
  x86Instruction *pxVar1;
  
  if (op == o_kill_register) {
    if (ctx->xmmRegRead[reg1] == false) {
      if (ctx->x86Base[ctx->xmmRegUpdate[reg1]].name != o_none) {
        ctx->x86Base[ctx->xmmRegUpdate[reg1]].name = o_none;
        ctx->optimizationCount = ctx->optimizationCount + 1;
      }
    }
    ctx->xmmReg[reg1].type = argNone;
  }
  else {
    if (op != o_read_register) {
      __assert_fail("!\"unknown instruction\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                    ,0x3e5,"void EMIT_OP_REG(CodeGenGenericContext &, x86Command, x86XmmReg)");
    }
    ctx->xmmRegRead[reg1] = true;
  }
  pxVar1 = ctx->x86Op;
  pxVar1->name = op;
  (pxVar1->argA).type = argXmmReg;
  (pxVar1->argA).field_1.xmmArg = reg1;
  pxVar1 = ctx->x86Op;
  (pxVar1->argB).type = argNone;
  ctx->x86Op = pxVar1 + 1;
  return;
}

Assistant:

void EMIT_OP_REG(CodeGenGenericContext &ctx, x86Command op, x86XmmReg reg1)
{
#ifdef NULLC_OPTIMIZE_X86
	switch(op)
	{
	case o_read_register:
		ctx.ReadRegister(reg1);
		break;
	case o_kill_register:
		ctx.KillRegister(reg1);
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argXmmReg;
	ctx.x86Op->argA.xmmArg = reg1;
	ctx.x86Op->argB.type = x86Argument::argNone;
	ctx.x86Op++;
}